

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O1

QString * nvarAttributesToUString(QString *__return_storage_ptr__,UINT8 attributes)

{
  QArrayData *pQVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QArrayData *local_28 [3];
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (1 < (byte)(attributes + 1)) {
    if ((attributes & 1) != 0) {
      QVar2.m_data = (storage_type *)0x9;
      QVar2.m_size = (qsizetype)local_28;
      QString::fromUtf8(QVar2);
      pQVar1 = local_28[0];
      QString::append((QString *)__return_storage_ptr__);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
    }
    if ((attributes & 2) != 0) {
      QVar3.m_data = (storage_type *)0xb;
      QVar3.m_size = (qsizetype)local_28;
      QString::fromUtf8(QVar3);
      pQVar1 = local_28[0];
      QString::append((QString *)__return_storage_ptr__);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
    }
    if ((attributes & 4) != 0) {
      QVar4.m_data = (storage_type *)0x6;
      QVar4.m_size = (qsizetype)local_28;
      QString::fromUtf8(QVar4);
      pQVar1 = local_28[0];
      QString::append((QString *)__return_storage_ptr__);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
    }
    if ((attributes & 8) != 0) {
      QVar5.m_data = (storage_type *)0xa;
      QVar5.m_size = (qsizetype)local_28;
      QString::fromUtf8(QVar5);
      pQVar1 = local_28[0];
      QString::append((QString *)__return_storage_ptr__);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
    }
    if ((attributes & 0x10) != 0) {
      QVar6.m_data = (storage_type *)0xb;
      QVar6.m_size = (qsizetype)local_28;
      QString::fromUtf8(QVar6);
      pQVar1 = local_28[0];
      QString::append((QString *)__return_storage_ptr__);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
    }
    if ((attributes & 0x20) != 0) {
      QVar7.m_data = (storage_type *)0xf;
      QVar7.m_size = (qsizetype)local_28;
      QString::fromUtf8(QVar7);
      pQVar1 = local_28[0];
      QString::append((QString *)__return_storage_ptr__);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
    }
    if ((attributes & 0x40) != 0) {
      QVar8.m_data = (storage_type *)0xb;
      QVar8.m_size = (qsizetype)local_28;
      QString::fromUtf8(QVar8);
      pQVar1 = local_28[0];
      QString::append((QString *)__return_storage_ptr__);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
    }
    if ((char)attributes < '\0') {
      QVar9.m_data = (storage_type *)0x7;
      QVar9.m_size = (qsizetype)local_28;
      QString::fromUtf8(QVar9);
      QString::append((QString *)__return_storage_ptr__);
      if (local_28[0] != (QArrayData *)0x0) {
        LOCK();
        (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_28[0],2,8);
        }
      }
    }
    QString::remove((longlong)__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

UString nvarAttributesToUString(const UINT8 attributes)
{
    if (attributes == 0x00 || attributes == 0xFF)
        return UString();
    
    UString str;
    if (attributes & NVRAM_NVAR_ENTRY_RUNTIME)         str += UString(", Runtime");
    if (attributes & NVRAM_NVAR_ENTRY_ASCII_NAME)      str += UString(", AsciiName");
    if (attributes & NVRAM_NVAR_ENTRY_GUID)            str += UString(", Guid");
    if (attributes & NVRAM_NVAR_ENTRY_DATA_ONLY)       str += UString(", DataOnly");
    if (attributes & NVRAM_NVAR_ENTRY_EXT_HEADER)      str += UString(", ExtHeader");
    if (attributes & NVRAM_NVAR_ENTRY_HW_ERROR_RECORD) str += UString(", HwErrorRecord");
    if (attributes & NVRAM_NVAR_ENTRY_AUTH_WRITE)      str += UString(", AuthWrite");
    if (attributes & NVRAM_NVAR_ENTRY_VALID)           str += UString(", Valid");
    
    str.remove(0, 2); // Remove first comma and space
    return str;
}